

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

bool dlib::string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  string_cast_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (str->_M_string_length == 1) {
    if (*(str->_M_dataplus)._M_p == '1') {
      return true;
    }
    if (*(str->_M_dataplus)._M_p == '0') {
      return false;
    }
  }
  pcVar2 = (str->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + str->_M_string_length);
  tolower<std::char_traits<char>,std::allocator<char>>(&local_68,(dlib *)local_48,str_00);
  iVar3 = std::__cxx11::string::compare((char *)&local_68);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (iVar3 != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar2,pcVar2 + str->_M_string_length);
    tolower<std::char_traits<char>,std::allocator<char>>(&local_68,(dlib *)local_48,str_01);
    iVar3 = std::__cxx11::string::compare((char *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    if (iVar3 == 0) {
      return false;
    }
    this = (string_cast_error *)__cxa_allocate_exception(0x30);
    pcVar2 = (str->_M_dataplus)._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + str->_M_string_length);
    string_cast_error::string_cast_error(this,&local_68);
    __cxa_throw(this,&string_cast_error::typeinfo,error::~error);
  }
  return true;
}

Assistant:

static bool cast (
            const std::basic_string<charT,traits,alloc>& str
        )
        {
            using namespace std;
            if (str.size() == 1 && str[0] == '1')
                return true;
            if (str.size() == 1 && str[0] == '0')
                return false;
            if (tolower(narrow(str)) == "true")
                return true;
            if (tolower(narrow(str)) == "false")
                return false;

            throw string_cast_error(narrow(str));
        }